

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Label __thiscall asmjit::v1_14::BaseBuilder::newLabel(BaseBuilder *this)

{
  CodeHolder *this_00;
  Error EVar1;
  uint32_t in_RDX [2];
  uint32_t extraout_RDX [2];
  uint32_t extraout_RDX_00 [2];
  undefined4 uVar2;
  BaseBuilder *in_RSI;
  Label LVar3;
  LabelEntry *le;
  
  this_00 = (in_RSI->super_BaseEmitter)._code;
  uVar2 = 0xffffffff;
  if (this_00 != (CodeHolder *)0x0) {
    EVar1 = CodeHolder::newLabelEntry(this_00,&le);
    in_RDX = extraout_RDX;
    if (EVar1 == 0) {
      EVar1 = BaseBuilder_newLabelInternal(in_RSI,*(uint32_t *)&le->field_0xc);
      in_RDX = extraout_RDX_00;
      if (EVar1 == 0) {
        uVar2 = *(undefined4 *)&le->field_0xc;
      }
    }
  }
  *(undefined4 *)&(this->super_BaseEmitter)._vptr_BaseEmitter = 5;
  *(undefined4 *)((long)&(this->super_BaseEmitter)._vptr_BaseEmitter + 4) = uVar2;
  (this->super_BaseEmitter)._emitterType = kNone;
  (this->super_BaseEmitter)._emitterFlags = kNone;
  (this->super_BaseEmitter)._instructionAlignment = '\0';
  (this->super_BaseEmitter)._reservedBaseEmitter = '\0';
  (this->super_BaseEmitter)._validationFlags = kNone;
  LVar3.super_Operand.super_Operand_._data[0] = in_RDX[0];
  LVar3.super_Operand.super_Operand_._data[1] = in_RDX[1];
  LVar3.super_Operand.super_Operand_._0_8_ = this;
  return (Label)LVar3.super_Operand.super_Operand_;
}

Assistant:

Label BaseBuilder::newLabel() {
  uint32_t labelId = Globals::kInvalidId;
  LabelEntry* le;

  if (_code &&
      _code->newLabelEntry(&le) == kErrorOk &&
      BaseBuilder_newLabelInternal(this, le->id()) == kErrorOk) {
    labelId = le->id();
  }

  return Label(labelId);
}